

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding2.c
# Opt level: O3

char * alignof_type(char *type,size_t *align)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  size_t ignored;
  byte *local_28;
  byte *local_20;
  size_t *local_18;
  
  local_18 = align;
  local_28 = (byte *)objc_skip_type_qualifiers(type);
  bVar1 = *local_28;
  if (bVar1 < 0x5b) {
    if (bVar1 < 0x3a) {
      if (bVar1 != 0x23) {
        if (bVar1 == 0x28) {
          pbVar2 = local_28 + 1;
          while( true ) {
            bVar1 = *pbVar2;
            pbVar2 = pbVar2 + 1;
            if (bVar1 == 0x3d) break;
            if (bVar1 == 0x29) {
              return (char *)pbVar2;
            }
          }
          bVar1 = *pbVar2;
          while (bVar1 != 0x29) {
            if (bVar1 == 0x22) {
              pbVar3 = pbVar2 + 1;
              do {
                pbVar2 = pbVar3 + 1;
                bVar1 = *pbVar3;
                pbVar3 = pbVar2;
              } while (bVar1 != 0x22);
            }
            pbVar2 = (byte *)alignof_type((char *)pbVar2,align);
            bVar1 = *pbVar2;
          }
          goto LAB_0011204a;
        }
        if (bVar1 != 0x2a) goto switchD_00111f42_caseD_41;
      }
      goto switchD_00111f42_caseD_4c;
    }
    switch(bVar1) {
    case 0x3f:
      break;
    case 0x40:
      uVar4 = 0x40;
      if (0x40 < *align) {
        uVar4 = *align;
      }
      *align = uVar4;
      if (local_28[1] == 0x22) {
        pbVar2 = local_28 + 1;
        do {
          local_28 = pbVar2 + 1;
          pbVar3 = pbVar2 + 1;
          pbVar2 = local_28;
        } while (*pbVar3 != 0x22);
      }
      else if (local_28[1] == 0x3f) {
        if (local_28[2] == 0x3c) {
          pbVar2 = local_28 + 2;
          do {
            local_28 = pbVar2 + 1;
            pbVar3 = pbVar2 + 1;
            pbVar2 = local_28;
          } while (*pbVar3 != 0x3e);
        }
        else {
          local_28 = local_28 + 1;
        }
      }
      break;
    case 0x41:
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x4a:
    case 0x4b:
    case 0x4d:
    case 0x4e:
    case 0x4f:
    case 0x50:
    case 0x52:
      goto switchD_00111f42_caseD_41;
    case 0x42:
    case 0x43:
      goto switchD_00111f42_caseD_42;
    case 0x44:
      uVar4 = *align;
      bVar6 = uVar4 < 0x81;
      uVar5 = 0x80;
      goto LAB_0011211b;
    case 0x49:
      goto switchD_00111f42_caseD_49;
    case 0x4c:
    case 0x51:
      goto switchD_00111f42_caseD_4c;
    case 0x53:
      goto switchD_00111f42_caseD_53;
    default:
      if (bVar1 != 0x3a) goto switchD_00111f42_caseD_41;
      goto switchD_00111f42_caseD_4c;
    }
    goto switchD_00111f42_caseD_3f;
  }
  switch(bVar1) {
  case 0x5e:
    uVar4 = 0x40;
    if (0x40 < *align) {
      uVar4 = *align;
    }
    *align = uVar4;
    local_20 = (byte *)0x0;
    local_28 = (byte *)alignof_type((char *)(local_28 + 1),(size_t *)&local_20);
    break;
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x6b:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x72:
  case 0x74:
  case 0x75:
  case 0x77:
  case 0x78:
  case 0x79:
  case 0x7a:
switchD_00111f42_caseD_41:
    abort();
  case 0x62:
    local_28 = local_28 + 1;
    strtol((char *)local_28,(char **)&local_28,10);
    local_28 = (byte *)alignof_type((char *)local_28,align);
    strtol((char *)local_28,(char **)&local_28,10);
    break;
  case 99:
switchD_00111f42_caseD_42:
    uVar4 = *align;
    bVar6 = uVar4 < 9;
    uVar5 = 8;
    goto LAB_0011211b;
  case 100:
  case 0x6c:
  case 0x71:
    goto switchD_00111f42_caseD_4c;
  case 0x66:
  case 0x69:
switchD_00111f42_caseD_49:
    uVar4 = *align;
    bVar6 = uVar4 < 0x21;
    uVar5 = 0x20;
    goto LAB_0011211b;
  case 0x6a:
    pbVar2 = local_28 + 1;
    bVar1 = local_28[1];
    if (bVar1 < 99) {
      switch(bVar1) {
      case 0x43:
        goto switchD_001120d8_caseD_63;
      case 0x44:
        uVar4 = *align;
        bVar6 = uVar4 < 0x81;
        uVar5 = 0x80;
        break;
      case 0x45:
      case 0x46:
      case 0x47:
      case 0x48:
      case 0x4a:
      case 0x4b:
switchD_001120d8_caseD_65:
        local_28 = pbVar2;
        pbVar2 = local_28 + 1;
        while( true ) {
          bVar1 = *pbVar2;
          pbVar2 = pbVar2 + 1;
          if (bVar1 == 0x3d) break;
          if (bVar1 == 0x7d) {
            return (char *)pbVar2;
          }
        }
        bVar1 = *pbVar2;
        while (bVar1 != 0x7d) {
          if (bVar1 == 0x22) {
            pbVar3 = pbVar2 + 1;
            do {
              pbVar2 = pbVar3 + 1;
              bVar1 = *pbVar3;
              pbVar3 = pbVar2;
            } while (bVar1 != 0x22);
          }
          pbVar2 = (byte *)alignof_type((char *)pbVar2,align);
          bVar1 = *pbVar2;
        }
        goto LAB_0011204a;
      case 0x49:
        goto switchD_001120d8_caseD_66;
      default:
        if (bVar1 != 0x51) {
          if (bVar1 == 0x53) goto switchD_001120d8_caseD_73;
          goto switchD_001120d8_caseD_65;
        }
      case 0x4c:
switchD_001120d8_caseD_64:
        uVar4 = *align;
        bVar6 = uVar4 < 0x41;
        uVar5 = 0x40;
      }
    }
    else {
      switch(bVar1) {
      case 99:
switchD_001120d8_caseD_63:
        uVar4 = *align;
        bVar6 = uVar4 < 9;
        uVar5 = 8;
        break;
      case 100:
      case 0x6c:
      case 0x71:
        goto switchD_001120d8_caseD_64;
      default:
        goto switchD_001120d8_caseD_65;
      case 0x66:
      case 0x69:
switchD_001120d8_caseD_66:
        uVar4 = *align;
        bVar6 = uVar4 < 0x21;
        uVar5 = 0x20;
        break;
      case 0x73:
switchD_001120d8_caseD_73:
        uVar4 = *align;
        bVar6 = uVar4 < 0x11;
        uVar5 = 0x10;
      }
    }
    if (!bVar6) {
      uVar5 = uVar4;
    }
    *align = uVar5;
    local_28 = local_28 + 2;
    break;
  case 0x73:
switchD_00111f42_caseD_53:
    uVar4 = *align;
    bVar6 = uVar4 < 0x11;
    uVar5 = 0x10;
LAB_0011211b:
    if (!bVar6) {
      uVar5 = uVar4;
    }
    *align = uVar5;
switchD_00111f42_caseD_3f:
    local_28 = local_28 + 1;
    break;
  case 0x76:
    goto switchD_00111f42_caseD_3f;
  case 0x7b:
    pbVar2 = local_28;
    goto switchD_001120d8_caseD_65;
  default:
    if (bVar1 != 0x5b) goto switchD_00111f42_caseD_41;
    local_20 = local_28 + 1;
    strtol((char *)local_20,(char **)&local_20,10);
    pbVar2 = (byte *)alignof_type((char *)local_20,(size_t *)&local_18);
LAB_0011204a:
    local_28 = pbVar2 + 1;
  }
  return (char *)local_28;
switchD_00111f42_caseD_4c:
  uVar4 = *align;
  bVar6 = uVar4 < 0x41;
  uVar5 = 0x40;
  goto LAB_0011211b;
}

Assistant:

static const char *alignof_type(const char *type, size_t *align)
{
	type = objc_skip_type_qualifiers(type);
	switch (*type)
	{
		// For all primitive types, we return the maximum of the new alignment
		// and the old one
#define APPLY_TYPE(typeName, name, capitalizedName, encodingChar) \
		case encodingChar:\
		{\
			*align = max((alignof(typeName) * 8), *align);\
			return type + 1;\
		}
#define NON_INTEGER_TYPES 1
#define SKIP_ID 1
#include "type_encoding_cases.h"
		case '@':
		{
			*align = max((alignof(id) * 8), *align);\
			return skip_object_extended_qualifiers(type) + 1;
		}
		case '?':
		case 'v': return type+1;
		case 'j':
		{
			type++;
			switch (*type)
			{
#define APPLY_TYPE(typeName, name, capitalizedName, encodingChar) \
		case encodingChar:\
		{\
			*align = max((alignof(_Complex typeName) * 8), *align);\
			return type + 1;\
		}
#include "type_encoding_cases.h"
			}
		}
		case '{':
		{
			const char *t = type;
			parse_struct(&t, (type_parser)alignof_type, align);
			return t;
		}
		case '(':
		{
			const char *t = type;
			parse_union(&t, (type_parser)alignof_type, align);
			return t;
		}
		case '[':
		{
			const char *t = type;
			parse_array(&t, (type_parser)alignof_type, &align);
			return t;
		}
		case 'b':
		{
			// Consume the b
			type++;
			// Ignore the offset
			strtol(type, (char**)&type, 10);
			// Alignment of a bitfield is the alignment of the type that
			// contains it
			type = alignof_type(type, align);
			// Ignore the number of bits
			strtol(type, (char**)&type, 10);
			return type;
		}
		case '^':
		{
			*align = max((alignof(void*) * 8), *align);
			// All pointers look the same to me.
			size_t ignored = 0;
			// Skip the definition of the pointeee type.
			return alignof_type(type+1, &ignored);
		}
	}
	abort();
	return NULL;
}